

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amount_tests.cpp
# Opt level: O3

void __thiscall amount_tests::ToStringTest::test_method(ToStringTest *this)

{
  int iVar1;
  iterator in_R8;
  iterator pvVar2;
  iterator in_R9;
  iterator pvVar3;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  FeeEstimateMode local_11c;
  lazy_ostream local_118;
  undefined1 *local_108;
  char *local_100;
  undefined1 *local_f8;
  undefined1 *local_f0;
  char *local_e8;
  char *local_e0;
  CFeeRate local_d8;
  char *local_d0;
  undefined **local_c8;
  undefined1 local_c0;
  undefined1 *local_b8;
  char **local_b0;
  string *local_a8;
  undefined **local_a0;
  undefined1 local_98;
  undefined1 *local_90;
  string **local_88;
  char *local_80;
  char *local_78;
  assertion_result local_70;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_d8.nSatoshisPerK = 1;
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_e0 = "";
  local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x89;
  file.m_begin = (iterator)&local_e8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_f8,msg);
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  local_11c = BTC_KVB;
  CFeeRate::ToString_abi_cxx11_(&local_58,&local_d8,&local_11c);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"0.00000001 BTC/kvB");
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_78 = "";
  local_88 = &local_a8;
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_013ae148;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_d0;
  local_d0 = "0.00000001 BTC/kvB";
  local_c0 = 0;
  local_c8 = &PTR__lazy_ostream_013ae468;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_a8 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_118,1,2,REQUIRE,0xe5ce9e,(size_t)&local_80,0x89,&local_a0,
             "\"0.00000001 BTC/kvB\"",&local_c8);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x8a;
  file_00.m_begin = (iterator)&local_130;
  msg_00.m_end = pvVar3;
  msg_00.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_140,
             msg_00);
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  local_11c = BTC_KVB;
  CFeeRate::ToString_abi_cxx11_(&local_58,&local_d8,&local_11c);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"0.00000001 BTC/kvB");
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_78 = "";
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_013ae148;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_a8;
  local_d0 = "0.00000001 BTC/kvB";
  local_c0 = 0;
  local_c8 = &PTR__lazy_ostream_013ae468;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_d0;
  pvVar2 = (iterator)0x1;
  pvVar3 = (iterator)0x2;
  local_a8 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_118,1,2,REQUIRE,0xe5ced9,(size_t)&local_80,0x8a,&local_a0,
             "\"0.00000001 BTC/kvB\"",&local_c8);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_148 = "";
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  local_158 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x8b;
  file_01.m_begin = (iterator)&local_150;
  msg_01.m_end = pvVar3;
  msg_01.m_begin = pvVar2;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_160,
             msg_01);
  local_118.m_empty = false;
  local_118._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_108 = boost::unit_test::lazy_ostream::inst;
  local_100 = "";
  local_11c = SAT_VB;
  CFeeRate::ToString_abi_cxx11_(&local_58,&local_d8,&local_11c);
  iVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_58,"0.001 sat/vB");
  local_70.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar1 == 0);
  local_70.m_message.px = (element_type *)0x0;
  local_70.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/amount_tests.cpp";
  local_78 = "";
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_013ae148;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_a8;
  local_d0 = "0.001 sat/vB";
  local_c0 = 0;
  local_c8 = &PTR__lazy_ostream_013ae288;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_d0;
  local_a8 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_70,&local_118,1,2,REQUIRE,0xe5cf04,(size_t)&local_80,0x8b,&local_a0,
             "\"0.001 sat/vB\"",&local_c8);
  boost::detail::shared_count::~shared_count(&local_70.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(ToStringTest)
{
    CFeeRate feeRate;
    feeRate = CFeeRate(1);
    BOOST_CHECK_EQUAL(feeRate.ToString(), "0.00000001 BTC/kvB");
    BOOST_CHECK_EQUAL(feeRate.ToString(FeeEstimateMode::BTC_KVB), "0.00000001 BTC/kvB");
    BOOST_CHECK_EQUAL(feeRate.ToString(FeeEstimateMode::SAT_VB), "0.001 sat/vB");
}